

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_checkCParams(ZSTD_compressionParameters cParams)

{
  size_t sVar1;
  
  sVar1 = 0xffffffffffffffd6;
  if ((((0xffffffe9 < cParams.windowLog - 0x20) && (0xffffffe6 < cParams.chainLog - 0x1f)) &&
      (0xffffffe6 < cParams.hashLog - 0x1f)) &&
     (((0xffffffe1 < cParams.searchLog - 0x1f && (0xfffffffa < cParams.minMatch - 8)) &&
      (cParams.targetLength < 0x20001)))) {
    sVar1 = 0xffffffffffffffd6;
    if (0xfffffff6 < cParams.strategy + ~ZSTD_btultra2) {
      sVar1 = 0;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_checkCParams(ZSTD_compressionParameters cParams)
{
    BOUNDCHECK(ZSTD_c_windowLog, (int)cParams.windowLog);
    BOUNDCHECK(ZSTD_c_chainLog,  (int)cParams.chainLog);
    BOUNDCHECK(ZSTD_c_hashLog,   (int)cParams.hashLog);
    BOUNDCHECK(ZSTD_c_searchLog, (int)cParams.searchLog);
    BOUNDCHECK(ZSTD_c_minMatch,  (int)cParams.minMatch);
    BOUNDCHECK(ZSTD_c_targetLength,(int)cParams.targetLength);
    BOUNDCHECK(ZSTD_c_strategy,  cParams.strategy);
    return 0;
}